

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O0

ZyanStatus
ZydisFormatterBasePrintAddressABS
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  char cVar1;
  int iVar2;
  ZyanU8 local_48;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanU8 padding;
  ulong uStack_30;
  ZyanStatus status_047620348;
  ZyanU64 address;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  address = (ZyanU64)context;
  context_local = (ZydisFormatterContext *)buffer;
  buffer_local = (ZydisFormatterBuffer *)formatter;
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xe2,
                  "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context == (ZydisFormatterContext *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                    ,0xe4,
                    "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                   );
    }
    formatter_local._4_4_ =
         ZydisCalcAbsoluteAddress
                   (context->instruction,context->operand,context->runtime_address,
                    &stack0xffffffffffffffd0);
    if ((formatter_local._4_4_ & 0x80000000) == 0) {
      if (*(int *)&(buffer_local->string).field_0x4 == -1) {
        local_48 = '\0';
      }
      else {
        local_48 = (ZyanU8)*(undefined4 *)&(buffer_local->string).field_0x4;
      }
      status_047620348_2._3_1_ = local_48;
      if ((*(int *)&(buffer_local->string).field_0x4 == -1) &&
         (*(int *)((long)&buffer_local->capacity + 4) == 1)) {
        cVar1 = *(char *)(*(long *)address + 0x17);
        if (cVar1 == '\x10') {
          status_047620348_2._3_1_ = '\x04';
          uStack_30 = uStack_30 & 0xffff;
        }
        else if (cVar1 == ' ') {
          status_047620348_2._3_1_ = '\b';
          uStack_30 = uStack_30 & 0xffffffff;
        }
        else {
          if (cVar1 != '@') {
            return 0x80100004;
          }
          status_047620348_2._3_1_ = '\x10';
        }
      }
      if ((*(char *)&context_local->instruction == '\0') ||
         (formatter_local._4_4_ =
               ZydisFormatterBufferAppend((ZydisFormatterBuffer *)context_local,'\b'),
         (formatter_local._4_4_ & 0x80000000) == 0)) {
        iVar2 = *(int *)((long)&buffer_local->capacity + 4);
        if (iVar2 == 0) {
          formatter_local._4_4_ =
               ZydisStringAppendDecU
                         ((ZyanString *)&context_local->operand,uStack_30,status_047620348_2._3_1_,
                          *(ZyanStringView **)
                           ((long)buffer_local +
                           (ulong)*(uint *)((long)&buffer_local->capacity + 4) * 0xb0 + 0x50),
                          *(ZyanStringView **)
                           ((long)buffer_local +
                           (ulong)*(uint *)((long)&buffer_local->capacity + 4) * 0xb0 + 0xa8));
        }
        else {
          if (iVar2 != 1) {
            return 0x80100004;
          }
          formatter_local._4_4_ =
               ZydisStringAppendHexU
                         ((ZyanString *)&context_local->operand,uStack_30,status_047620348_2._3_1_,
                          *(ZyanBool *)((long)&(buffer_local->string).vector.data + 1),
                          *(ZyanBool *)&(buffer_local->string).vector.data,
                          *(ZyanStringView **)
                           ((long)buffer_local +
                           (ulong)*(uint *)((long)&buffer_local->capacity + 4) * 0xb0 + 0x50),
                          *(ZyanStringView **)
                           ((long)buffer_local +
                           (ulong)*(uint *)((long)&buffer_local->capacity + 4) * 0xb0 + 0xa8));
        }
        if ((formatter_local._4_4_ & 0x80000000) == 0) {
          formatter_local._4_4_ = 0x100000;
        }
      }
    }
    return formatter_local._4_4_;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                ,0xe3,
                "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZyanU64 address;
    ZYAN_CHECK(ZydisCalcAbsoluteAddress(context->instruction, context->operand,
        context->runtime_address, &address));
    ZyanU8 padding = (formatter->addr_padding_absolute ==
        ZYDIS_PADDING_AUTO) ? 0 : (ZyanU8)formatter->addr_padding_absolute;
    if ((formatter->addr_padding_absolute == ZYDIS_PADDING_AUTO) &&
        (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX))
    {
        switch (context->instruction->address_width)
        {
        case 16:
            padding =  4;
            address = (ZyanU16)address;
            break;
        case 32:
            padding =  8;
            address = (ZyanU32)address;
            break;
        case 64:
            padding = 16;
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_ADDRESS_ABS);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string, address, padding,
        formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}